

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

int get_framename(frameex1 *fx_addr68k)

{
  LispPTR *pLVar1;
  LispPTR local_1c;
  LispPTR scratch;
  fnhead *fnheader;
  frameex1 *fx_addr68k_local;
  
  if ((*(ushort *)&fx_addr68k->field_0x2 >> 9 & 1) == 0) {
    local_1c = fx_addr68k->fnheader;
  }
  else {
    local_1c = fx_addr68k->nametable;
  }
  pLVar1 = NativeAligned4FromLAddr(local_1c);
  return pLVar1[2] & 0xfffffff;
}

Assistant:

int get_framename(struct frameex1 *fx_addr68k) {
  struct fnhead *fnheader;
  LispPTR scratch;

/* Get FNHEAD */
#ifdef BIGVM
  if (fx_addr68k->validnametable == 0) {
    scratch = (unsigned int)(fx_addr68k->fnheader);
  } else {
    scratch = (unsigned int)(fx_addr68k->nametable);
  }
#else
  if (fx_addr68k->validnametable == 0) {
    scratch = (unsigned int)(fx_addr68k->hi2fnheader << 16);
    scratch |= (unsigned int)(fx_addr68k->lofnheader);
  } else {
    scratch = (unsigned int)(fx_addr68k->hi2nametable << 16);
    scratch |= (unsigned int)(fx_addr68k->lonametable);
  }
#endif /* BIGVM */
  fnheader = (struct fnhead *)NativeAligned4FromLAddr(scratch);
  return (fnheader->framename);
}